

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_5ed0ff::SF_Crypt::setDecodeParms(SF_Crypt *this,QPDFObjectHandle *decode_parms)

{
  bool bVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  QPDFObjectHandle *local_c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar1 = QPDFObjectHandle::isNull(decode_parms);
  bVar3 = true;
  if (!bVar1) {
    local_c8 = decode_parms;
    QPDFObjectHandle::getKeys_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_c0,decode_parms);
    bVar3 = true;
    for (p_Var2 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &local_c0._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var2 + 1),"/Type");
      if (bVar1) {
LAB_001c6172:
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"/Type",&local_c9);
        bVar1 = QPDFObjectHandle::hasKey(local_c8,&local_50);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"/CryptFilterDecodeParms",&local_ca);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_cb);
          bVar1 = QPDFObjectHandle::isDictionaryOfType(local_c8,&local_70,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_70);
          bVar3 = (bool)(bVar1 & bVar3);
        }
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(p_Var2 + 1),"/Name");
        if (bVar1) goto LAB_001c6172;
        bVar3 = false;
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_c0);
  }
  return bVar3;
}

Assistant:

bool
        setDecodeParms(QPDFObjectHandle decode_parms) override
        {
            if (decode_parms.isNull()) {
                return true;
            }
            bool filterable = true;
            for (auto const& key: decode_parms.getKeys()) {
                if (((key == "/Type") || (key == "/Name")) &&
                    ((!decode_parms.hasKey("/Type")) ||
                     decode_parms.isDictionaryOfType("/CryptFilterDecodeParms"))) {
                    // we handle this in decryptStream
                } else {
                    filterable = false;
                }
            }
            return filterable;
        }